

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O3

void __thiscall cfd::core::Script::Script(Script *this,Script *object)

{
  this->_vptr_Script = (_func_int **)&PTR__Script_00721878;
  ByteData::ByteData(&this->script_data_);
  (this->script_stack_).
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->script_stack_).
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->script_stack_).
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->script_data_,
             &(object->script_data_).data_);
  ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::operator=
            (&this->script_stack_,&object->script_stack_);
  return;
}

Assistant:

Script::Script(const Script& object) {
  script_data_ = object.script_data_;
  script_stack_ = object.script_stack_;
}